

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O0

void __thiscall
wigwag::detail::
listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::handler_node::handler_node
          (handler_node *this,
          intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
          *impl,handler_type *handler)

{
  listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  *this_00;
  handlers_container *this_01;
  handler_type *handler_local;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  *impl_local;
  handler_node *this_local;
  
  token::implementation::implementation(&this->super_implementation);
  life_assurance::intrusive_life_tokens::life_assurance::life_assurance(&this->super_life_assurance)
  ;
  intrusive_list_node::intrusive_list_node(&this->super_intrusive_list_node);
  (this->super_implementation)._vptr_implementation = (_func_int **)&PTR_release_token_impl_004f5fc8
  ;
  (this->super_life_assurance)._vptr_life_assurance = (_func_int **)&PTR__handler_node_004f5ff8;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ::intrusive_ptr(&this->_listenable_impl,impl);
  storage_for<std::function<void()>>::storage_for<std::function<void()>>
            ((storage_for<std::function<void()>> *)&(this->_handler).obj,handler);
  this_00 = intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
            ::operator->(&this->_listenable_impl);
  this_01 = get_handlers_container(this_00);
  intrusive_list<wigwag::detail::listenable_impl<std::function<void_()>,_wigwag::exception_handling::none,_wigwag::threading::own_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>::handler_node>
  ::push_back(this_01,this);
  return;
}

Assistant:

handler_node(intrusive_ptr<listenable_impl> impl, handler_type handler)
                : _listenable_impl(std::move(impl)), _handler(std::move(handler))
            { _listenable_impl->get_handlers_container().push_back(*this); }